

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::DefaultLogDispatchCallback::dispatch(DefaultLogDispatchCallback *this,string_t *logLine)

{
  Level LVar1;
  LogMessage *pLVar2;
  TypedConfigurations *pTVar3;
  fstream_t *fs;
  Logger *pLVar4;
  bool bVar5;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar6;
  __node_base_ptr p_Var7;
  unsigned_long uVar8;
  uint uVar9;
  Level local_34;
  
  if (this->m_data->m_dispatchAction != NormalLog) {
    return;
  }
  pLVar2 = this->m_data->m_logMessage;
  pTVar3 = pLVar2->m_logger->m_typedConfigurations;
  LVar1 = pLVar2->m_level;
  (*(pTVar3->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar3);
  bVar5 = TypedConfigurations::unsafeGetConfigByVal<bool>
                    (pTVar3,LVar1,&pTVar3->m_toFileMap,"toFile");
  if (bVar5) {
    pLVar2 = this->m_data->m_logMessage;
    pTVar3 = pLVar2->m_logger->m_typedConfigurations;
    LVar1 = pLVar2->m_level;
    (*(pTVar3->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar3);
    psVar6 = TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                       (pTVar3,LVar1,&pTVar3->m_fileStreamMap,"fileStream");
    fs = (psVar6->
         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    if ((fs != (fstream_t *)0x0) &&
       (std::ostream::write((char *)(fs + 0x10),(long)(logLine->_M_dataplus)._M_p),
       ((byte)fs[*(long *)(*(long *)fs + -0x18) + 0x20] & 5) == 0)) {
      if ((*(byte *)(elStorage + 0x18) & 0x10) == 0) {
        pLVar2 = this->m_data->m_logMessage;
        pLVar4 = pLVar2->m_logger;
        local_34 = pLVar2->m_level;
        p_Var7 = utils::std::
                 _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&(pLVar4->m_unflushedCount)._M_h,
                            (ulong)local_34 % (pLVar4->m_unflushedCount)._M_h._M_bucket_count,
                            &local_34,(ulong)local_34);
        LVar1 = local_34;
        uVar9 = *(int *)((long)&p_Var7->_M_nxt[1]._M_nxt + 4) + 1;
        *(uint *)((long)&p_Var7->_M_nxt[1]._M_nxt + 4) = uVar9;
        pTVar3 = pLVar4->m_typedConfigurations;
        (*(pTVar3->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar3);
        uVar8 = TypedConfigurations::unsafeGetConfigByVal<unsigned_long>
                          (pTVar3,LVar1,&pTVar3->m_logFlushThresholdMap,"logFlushThreshold");
        if (uVar9 < uVar8) goto LAB_00168396;
      }
      pLVar2 = this->m_data->m_logMessage;
      Logger::flush(pLVar2->m_logger,pLVar2->m_level,fs);
    }
  }
LAB_00168396:
  pLVar2 = this->m_data->m_logMessage;
  pTVar3 = pLVar2->m_logger->m_typedConfigurations;
  LVar1 = pLVar2->m_level;
  (*(pTVar3->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar3);
  bVar5 = TypedConfigurations::unsafeGetConfigByVal<bool>
                    (pTVar3,LVar1,&pTVar3->m_toStandardOutputMap,"toStandardOutput");
  if (bVar5) {
    if ((*(byte *)(elStorage + 0x18) & 0x40) != 0) {
      pLVar2 = this->m_data->m_logMessage;
      LogBuilder::convertToColoredOutput
                ((pLVar2->m_logger->m_logBuilder).
                 super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr,logLine,
                 pLVar2->m_level);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(logLine->_M_dataplus)._M_p,logLine->_M_string_length);
    std::ostream::flush();
  }
  return;
}

Assistant:

void DefaultLogDispatchCallback::dispatch(base::type::string_t&& logLine) {
  if (m_data->dispatchAction() == base::DispatchAction::NormalLog) {
    if (m_data->logMessage()->logger()->m_typedConfigurations->toFile(m_data->logMessage()->level())) {
      base::type::fstream_t* fs = m_data->logMessage()->logger()->m_typedConfigurations->fileStream(
                                    m_data->logMessage()->level());
      if (fs != nullptr) {
        fs->write(logLine.c_str(), logLine.size());
        if (fs->fail()) {
          ELPP_INTERNAL_ERROR("Unable to write log to file ["
                              << m_data->logMessage()->logger()->m_typedConfigurations->filename(m_data->logMessage()->level()) << "].\n"
                              << "Few possible reasons (could be something else):\n" << "      * Permission denied\n"
                              << "      * Disk full\n" << "      * Disk is not writable", true);
        } else {
          if (ELPP->hasFlag(LoggingFlag::ImmediateFlush)
              || (m_data->logMessage()->logger()->isFlushNeeded(m_data->logMessage()->level()))) {
            m_data->logMessage()->logger()->flush(m_data->logMessage()->level(), fs);
          }
        }
      } else {
        ELPP_INTERNAL_ERROR("Log file for [" << LevelHelper::convertToString(m_data->logMessage()->level()) << "] "
                            << "has not been configured but [TO_FILE] is configured to TRUE. [Logger ID: "
                            << m_data->logMessage()->logger()->id() << "]", false);
      }
    }
    if (m_data->logMessage()->logger()->m_typedConfigurations->toStandardOutput(m_data->logMessage()->level())) {
      if (ELPP->hasFlag(LoggingFlag::ColoredTerminalOutput))
        m_data->logMessage()->logger()->logBuilder()->convertToColoredOutput(&logLine, m_data->logMessage()->level());
      ELPP_COUT << ELPP_COUT_LINE(logLine);
    }
  }
#if defined(ELPP_SYSLOG)
  else if (m_data->dispatchAction() == base::DispatchAction::SysLog) {
    // Determine syslog priority
    int sysLogPriority = 0;
    if (m_data->logMessage()->level() == Level::Fatal)
      sysLogPriority = LOG_EMERG;
    else if (m_data->logMessage()->level() == Level::Error)
      sysLogPriority = LOG_ERR;
    else if (m_data->logMessage()->level() == Level::Warning)
      sysLogPriority = LOG_WARNING;
    else if (m_data->logMessage()->level() == Level::Info)
      sysLogPriority = LOG_INFO;
    else if (m_data->logMessage()->level() == Level::Debug)
      sysLogPriority = LOG_DEBUG;
    else
      sysLogPriority = LOG_NOTICE;
#  if defined(ELPP_UNICODE)
    char* line = base::utils::Str::wcharPtrToCharPtr(logLine.c_str());
    syslog(sysLogPriority, "%s", line);
    free(line);
#  else
    syslog(sysLogPriority, "%s", logLine.c_str());
#  endif
  }
#endif  // defined(ELPP_SYSLOG)
}